

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O1

QStringList * QFontDatabase::styles(QStringList *__return_storage_ptr__,QString *family)

{
  QtFontFoundry *pQVar1;
  QtFontStyle *pQVar2;
  int iVar3;
  Type *pTVar4;
  QtFontFamily *pQVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  QDeadlineTimer QVar8;
  QtFontFoundry allStyles;
  QString local_88;
  QString local_68;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char16_t *)0x0;
  local_68.d.size = 0;
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (char16_t *)0x0;
  local_88.d.size = 0;
  parseFontName(family,&local_88,&local_68);
  pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                       *)family);
  if (pTVar4 != (Type *)0x0) {
    QVar8.t2 = 0xffffffff;
    QVar8.type = 0x7fffffff;
    QVar8.t1 = (qint64)pTVar4;
    QRecursiveMutex::tryLock(QVar8);
  }
  QFontDatabasePrivate::ensureFontDatabase();
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar5 = QFontDatabasePrivate::family
                     (&QFontDatabasePrivate::instance::instance,&local_68,EnsurePopulated);
  if (pQVar5 != (QtFontFamily *)0x0) {
    allStyles.name.d.d = local_88.d.d;
    allStyles.name.d.ptr = local_88.d.ptr;
    allStyles.name.d.size = local_88.d.size;
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    allStyles.count = 0;
    allStyles._28_4_ = 0xaaaaaaaa;
    allStyles.styles = (QtFontStyle **)0x0;
    if (0 < pQVar5->count) {
      lVar6 = 0;
      do {
        pQVar1 = pQVar5->foundries[lVar6];
        if (local_88.d.size == 0) {
LAB_0025bc32:
          if (0 < pQVar1->count) {
            lVar7 = 0;
            do {
              local_50.d.d = (Data *)CONCAT44(local_50.d.d._4_4_,0xaaaaaaaa);
              local_50.d.d = (Data *)(CONCAT62(local_50.d.d._2_6_,
                                               *(undefined2 *)&pQVar1->styles[lVar7]->key) &
                                     0xffffffffffff0fff);
              local_50.d.d._0_3_ = (uint3)(ushort)local_50.d.d;
              QtFontFoundry::style
                        (&allStyles,(Key *)&local_50,&pQVar1->styles[lVar7]->styleName,true);
              lVar7 = lVar7 + 1;
            } while (lVar7 < pQVar1->count);
          }
        }
        else {
          iVar3 = QString::compare(&pQVar1->name,(CaseSensitivity)&local_88);
          if (iVar3 == 0) goto LAB_0025bc32;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pQVar5->count);
    }
    QList<QString>::reserve(__return_storage_ptr__,(long)allStyles.count);
    if (0 < allStyles.count) {
      lVar6 = 0;
      do {
        pQVar2 = allStyles.styles[lVar6];
        lVar7 = (pQVar2->styleName).d.size;
        if (lVar7 == 0) {
          styleStringHelper(&local_50,*(ushort *)&pQVar2->key >> 2 & 0x3ff,
                            *(ushort *)&pQVar2->key & (StyleOblique|StyleItalic));
        }
        else {
          local_50.d.d = (pQVar2->styleName).d.d;
          local_50.d.ptr = (pQVar2->styleName).d.ptr;
          local_50.d.size = lVar7;
          if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((local_50.d.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((local_50.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_50);
        QList<QString>::end(__return_storage_ptr__);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < allStyles.count);
    }
    QtFontFoundry::~QtFontFoundry(&allStyles);
  }
  if (pTVar4 != (Type *)0x0) {
    QRecursiveMutex::unlock();
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QFontDatabase::styles(const QString &family)
{
    QString familyName, foundryName;
    parseFontName(family, foundryName, familyName);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QStringList l;
    QtFontFamily *f = d->family(familyName);
    if (!f)
        return l;

    QtFontFoundry allStyles(foundryName);
    for (int j = 0; j < f->count; j++) {
        QtFontFoundry *foundry = f->foundries[j];
        if (foundryName.isEmpty() || foundry->name.compare(foundryName, Qt::CaseInsensitive) == 0) {
            for (int k = 0; k < foundry->count; k++) {
                QtFontStyle::Key ke(foundry->styles[k]->key);
                ke.stretch = 0;
                allStyles.style(ke, foundry->styles[k]->styleName, true);
            }
        }
    }

    l.reserve(allStyles.count);
    for (int i = 0; i < allStyles.count; i++) {
        l.append(allStyles.styles[i]->styleName.isEmpty() ?
                 styleStringHelper(allStyles.styles[i]->key.weight,
                                   (QFont::Style)allStyles.styles[i]->key.style) :
                 allStyles.styles[i]->styleName);
    }
    return l;
}